

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O2

Event_handler * __thiscall
iqnet::Reactor<boost::mutex>::find_handler(Reactor<boost::mutex> *this,Handler fd)

{
  iterator iVar1;
  _Base_ptr p_Var2;
  scoped_lock lk;
  Handler local_24;
  unique_lock<boost::mutex> local_20;
  
  local_24 = fd;
  boost::unique_lock<boost::mutex>::unique_lock(&local_20,&this->lock);
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_iqnet::Event_handler_*>,_std::_Select1st<std::pair<const_int,_iqnet::Event_handler_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
          ::find(&(this->handlers)._M_t,&local_24);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->handlers)._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = (_Base_ptr)0x0;
  }
  else {
    p_Var2 = iVar1._M_node[1]._M_parent;
  }
  boost::unique_lock<boost::mutex>::~unique_lock(&local_20);
  return (Event_handler *)p_Var2;
}

Assistant:

iqnet::Event_handler* Reactor<Lock>::find_handler(Socket::Handler fd)
{
  scoped_lock lk(lock);
  h_iterator i = handlers.find(fd);
  return i == handlers.end() ? NULL : i->second;
}